

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O3

void __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::Build_Cq
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_> *this,
          ChSparseMatrix *storage,int insrow)

{
  int iVar1;
  int j;
  long lVar2;
  
  if (this->variables_1->disabled == false) {
    iVar1 = this->variables_1->offset;
    lVar2 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                 .m_data.array[lVar2],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar2),
                 1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  if (this->variables_2->disabled == false) {
    iVar1 = this->variables_2->offset;
    lVar2 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                 .m_data.array[lVar2],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar2),
                 1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  if (this->variables_3->disabled == false) {
    iVar1 = this->variables_3->offset;
    lVar2 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                 .m_data.array[lVar2],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar2),
                 1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  return;
}

Assistant:

void Build_Cq(ChSparseMatrix& storage, int insrow) {
        if (variables_1->IsActive())
            PasteMatrix(storage, Cq_1, insrow, variables_1->GetOffset());
        if (variables_2->IsActive())
            PasteMatrix(storage, Cq_2, insrow, variables_2->GetOffset());
        if (variables_3->IsActive())
            PasteMatrix(storage, Cq_3, insrow, variables_3->GetOffset());
    }